

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cpp
# Opt level: O3

GlobRank __thiscall
slang::svGlobInternal
          (slang *this,path *basePath,string_view pattern,GlobMode mode,
          SmallVector<std::filesystem::__cxx11::path,_2UL> *results,bool *anyWildcards)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  GlobRank GVar4;
  path *dir;
  pointer ppVar5;
  path *path;
  path *args;
  undefined4 in_register_00000084;
  SmallVector<std::filesystem::__cxx11::path,_2UL> *results_00;
  SmallVector<std::filesystem::__cxx11::path,_2UL> *pSVar6;
  short *psVar7;
  long lVar8;
  path *dir_1;
  path *ppVar9;
  string_view pattern_00;
  string_view pattern_01;
  string_view pattern_02;
  string_view pattern_03;
  path currPath;
  SmallVector<std::filesystem::__cxx11::path,_2UL> dirs;
  flat_hash_set<std::string> visited;
  path local_f8;
  short *local_d0;
  SmallVector<std::filesystem::__cxx11::path,_2UL> local_c8;
  table_core<boost::unordered::detail::foa::flat_set_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  results_00 = (SmallVector<std::filesystem::__cxx11::path,_2UL> *)
               CONCAT44(in_register_00000084,mode);
  pattern_02._M_str._0_4_ = (uint)pattern._M_str;
  pSVar6 = results;
  std::filesystem::__cxx11::path::path(&local_f8,(path *)this);
  psVar7 = (short *)pattern._M_len;
  ppVar9 = basePath;
  local_d0 = (short *)pattern._M_len;
  do {
    if (ppVar9 == (path *)0x0) {
      if ((uint)pattern_02._M_str == 0) {
        GVar4 = Directory;
        iterDirectory(&local_f8,results_00,Files);
      }
      else {
        local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ =
             (pointer)((ulong)local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_.
                              _4_4_ << 0x20);
        local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.len =
             std::_V2::system_category();
        cVar3 = std::filesystem::status(&local_f8,(error_code *)&local_c8);
        if (cVar3 == '\x02') {
          SmallVectorBase<std::filesystem::__cxx11::path>::
          emplace_back<std::filesystem::__cxx11::path>
                    (&results_00->super_SmallVectorBase<std::filesystem::__cxx11::path>,&local_f8);
        }
        GVar4 = Directory;
        if ((basePath != (path *)0x0) && ((basePath != (path *)0x1 || ((char)*local_d0 != '/')))) {
LAB_0021deb1:
          GVar4 = SimpleName;
        }
      }
LAB_0021deb7:
      std::filesystem::__cxx11::path::~path(&local_f8);
      return GVar4;
    }
    if (((path *)0x2 < ppVar9) && ((char)psVar7[1] == '.' && *psVar7 == 0x2e2e)) {
      local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ =
           (pointer)local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.firstElement;
      local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.len = 0;
      local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.cap = 2;
      local_60.arrays.groups_size_index = 0x3f;
      local_60.arrays.groups_size_mask = 1;
      local_60.arrays.elements_ = (value_type_pointer)0x0;
      local_60.arrays.groups_ =
           (group_type_pointer)
           boost::unordered::detail::foa::
           dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
           ::storage;
      local_60.size_ctrl.ml = 0;
      local_60.size_ctrl.size = 0;
      iterDirectoriesRecursive(&local_f8,&local_c8,(flat_hash_set<std::string> *)&local_60);
      args = &local_f8;
      SmallVectorBase<std::filesystem::__cxx11::path>::emplace_back<std::filesystem::__cxx11::path>
                (&local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>,args);
      if (local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.len == 0) {
        GVar4 = Directory;
      }
      else {
        ppVar9 = (path *)((long)&ppVar9[-1]._M_cmpts._M_impl._M_t.
                                 super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                 .
                                 super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                         + 5);
        lVar8 = local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.len * 0x28;
        ppVar5 = local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_;
        do {
          pattern_03._M_str._0_4_ = (uint)pattern_02._M_str;
          pattern_03._M_len = (size_t)((long)psVar7 + 3);
          pattern_03._M_str._4_4_ = 0;
          args = ppVar9;
          GVar4 = svGlobInternal((slang *)ppVar5,ppVar9,pattern_03,(GlobMode)results_00,results,
                                 (bool *)results_00);
          ppVar5 = ppVar5 + 1;
          lVar8 = lVar8 + -0x28;
        } while (lVar8 != 0);
      }
      *(undefined1 *)&(results->super_SmallVectorBase<std::filesystem::__cxx11::path>).data_ = 1;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~table_core(&local_60);
LAB_0021e0a5:
      SmallVectorBase<std::filesystem::__cxx11::path>::cleanup
                (&local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>,
                 (EVP_PKEY_CTX *)args);
      goto LAB_0021deb7;
    }
    path = (path *)0x0;
    bVar2 = false;
    while( true ) {
      bVar1 = bVar2;
      cVar3 = *(char *)((long)psVar7 + (long)path);
      bVar2 = (bool)((cVar3 == '*' || cVar3 == '?') | bVar1);
      if (cVar3 == '/') break;
      path = (path *)((long)&(path->_M_pathname)._M_dataplus._M_p + 1);
      if (ppVar9 == path) {
        if ((cVar3 == '*' || cVar3 == '?') || bVar1) {
          pattern_00._M_str = (char *)results_00;
          pattern_00._M_len = (size_t)psVar7;
          globDir((slang *)&local_f8,ppVar9,pattern_00,
                  (SmallVector<std::filesystem::__cxx11::path,_2UL> *)(ulong)(uint)pattern_02._M_str
                  ,(GlobMode)pSVar6);
          *(undefined1 *)&(results->super_SmallVectorBase<std::filesystem::__cxx11::path>).data_ = 1
          ;
          GVar4 = WildcardName;
          goto LAB_0021deb7;
        }
        local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ =
             (pointer)((ulong)local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_.
                              _4_4_ << 0x20);
        local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.len =
             std::_V2::system_category();
        std::filesystem::__cxx11::path::_M_append(&local_f8,ppVar9,psVar7);
        if ((uint)pattern_02._M_str == 1) {
          cVar3 = std::filesystem::status(&local_f8,(error_code *)&local_c8);
          if (cVar3 != '\x02') goto LAB_0021deb1;
        }
        else if (((uint)pattern_02._M_str != 0) ||
                (cVar3 = std::filesystem::status(&local_f8,(error_code *)&local_c8), cVar3 != '\x01'
                )) goto LAB_0021deb1;
        SmallVectorBase<std::filesystem::__cxx11::path>::
        emplace_back<std::filesystem::__cxx11::path>
                  (&results_00->super_SmallVectorBase<std::filesystem::__cxx11::path>,&local_f8);
        goto LAB_0021deb1;
      }
    }
    if (bVar2) {
      local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ =
           (pointer)local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.firstElement;
      local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.len = 0;
      local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.cap = 2;
      pattern_01._M_str = (char *)&local_c8;
      pattern_01._M_len = (size_t)psVar7;
      args = path;
      globDir((slang *)&local_f8,path,pattern_01,
              (SmallVector<std::filesystem::__cxx11::path,_2UL> *)0x1,(GlobMode)pSVar6);
      if (local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.len == 0) {
        GVar4 = Directory;
      }
      else {
        ppVar9 = (path *)((long)&(ppVar9->_M_pathname)._M_dataplus._M_p + ~(ulong)path);
        lVar8 = local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.len * 0x28;
        ppVar5 = local_c8.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_;
        do {
          pattern_02._M_len = (size_t)((char *)((long)psVar7 + (long)path) + 1);
          pattern_02._M_str._4_4_ = 0;
          args = ppVar9;
          GVar4 = svGlobInternal((slang *)ppVar5,ppVar9,pattern_02,(GlobMode)results_00,results,
                                 (bool *)results_00);
          ppVar5 = ppVar5 + 1;
          lVar8 = lVar8 + -0x28;
        } while (lVar8 != 0);
      }
      *(undefined1 *)&(results->super_SmallVectorBase<std::filesystem::__cxx11::path>).data_ = 1;
      goto LAB_0021e0a5;
    }
    ppVar9 = (path *)((long)&(ppVar9->_M_pathname)._M_dataplus._M_p + ~(ulong)path);
    std::filesystem::__cxx11::path::_M_append(&local_f8,path,psVar7);
    psVar7 = (short *)((char *)((long)psVar7 + (long)path) + 1);
  } while( true );
}

Assistant:

GlobRank svGlobInternal(const fs::path& basePath, std::string_view pattern, GlobMode mode,
                        SmallVector<fs::path>& results, bool& anyWildcards) {
    // Parse the pattern. Consume directories in chunks until
    // we find one that has wildcards for us to handle.
    auto currPath = basePath;
    const auto originalPattern = pattern;
    while (!pattern.empty()) {
        // The '...' pattern only applies at the start of a segment,
        // and means to recursively pull all directories.
        if (pattern.starts_with("..."sv)) {
            SmallVector<fs::path> dirs;
            flat_hash_set<std::string> visited;
            iterDirectoriesRecursive(currPath, dirs, visited);
            dirs.emplace_back(std::move(currPath));

            pattern = pattern.substr(3);

            auto rank = GlobRank::Directory;
            for (auto& dir : dirs)
                rank = svGlobInternal(dir, pattern, mode, results, anyWildcards);

            anyWildcards = true;
            return rank;
        }

        bool hasWildcards = false;
        bool foundDir = false;
        for (size_t i = 0; i < pattern.size(); i++) {
            char c = pattern[i];
            hasWildcards |= (c == '?' || c == '*');
            if (c == fs::path::preferred_separator) {
                auto subPattern = pattern.substr(0, i);
                pattern = pattern.substr(i + 1);

                // If this directory entry had wildcards we need to expand them
                // and recursively search within each expanded directory.
                if (hasWildcards) {
                    SmallVector<fs::path> dirs;
                    globDir(currPath, subPattern, dirs, GlobMode::Directories);

                    auto rank = GlobRank::Directory;
                    for (auto& dir : dirs)
                        rank = svGlobInternal(dir, pattern, mode, results, anyWildcards);

                    anyWildcards = true;
                    return rank;
                }

                // Otherwise just record this directory and move on to the next.
                foundDir = true;
                currPath /= subPattern;
                break;
            }
        }

        // We didn't find a directory separator, so we're going to consume
        // the remainder of the pattern and search for files/directories with
        // that pattern.
        if (!foundDir) {
            if (hasWildcards) {
                globDir(currPath, pattern, results, mode);
                anyWildcards = true;
                return GlobRank::WildcardName;
            }

            // Check for an exact match and add the target if we find it.
            std::error_code ec;
            currPath /= pattern;

            if ((mode == GlobMode::Files && fs::is_regular_file(currPath, ec)) ||
                (mode == GlobMode::Directories && fs::is_directory(currPath, ec))) {
                results.emplace_back(std::move(currPath));
            }

            return GlobRank::SimpleName;
        }
    }

    // If we reach this point, we either had an empty pattern to
    // begin with or we consumed the whole pattern and it had a trailing
    // directory separator. If we are searching for files we want to include
    // all files underneath the directory pointed to by currPath, and if
    // we're searching for directories we'll just take this directory.
    if (mode == GlobMode::Files) {
        iterDirectory(currPath, results, GlobMode::Files);
        return GlobRank::Directory;
    }
    else {
        std::error_code ec;
        if (fs::is_directory(currPath, ec))
            results.emplace_back(std::move(currPath));

        if (originalPattern.empty() ||
            (originalPattern.size() == 1 && originalPattern[0] == fs::path::preferred_separator)) {
            return GlobRank::Directory;
        }
        else {
            return GlobRank::SimpleName;
        }
    }
}